

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_helpers.hpp
# Opt level: O2

void duckdb::AddToHugeint::AddConstant<duckdb::SumState<duckdb::hugeint_t>,int>
               (SumState<duckdb::hugeint_t> *state,int input,idx_t count)

{
  bool bVar1;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t addition;
  
  if (-1 < input) {
    AddValue(&state->value,(uint)input * count,1);
    return;
  }
  if (count < 8) {
    while (bVar1 = count != 0, count = count - 1, bVar1) {
      AddValue(&state->value,(long)input,0);
    }
  }
  else {
    hugeint_t::hugeint_t(&local_38,(long)input);
    local_48 = Hugeint::Convert<unsigned_long>(count);
    addition = hugeint_t::operator*(&local_38,&local_48);
    hugeint_t::operator+=(&state->value,&addition);
  }
  return;
}

Assistant:

static void AddConstant(STATE &state, T input, idx_t count) {
		// add a constant X number of times
		// fast path: check if value * count fits into a uint64_t
		// note that we check if value * VECTOR_SIZE fits in a uint64_t to avoid having to actually do a division
		// this is still a pretty high number (18014398509481984) so most positive numbers will fit
		if (input >= 0 && uint64_t(input) < (NumericLimits<uint64_t>::Maximum() / STANDARD_VECTOR_SIZE)) {
			// if it does just multiply it and add the value
			uint64_t value = uint64_t(input) * count;
			AddValue(state.value, value, 1);
		} else {
			// if it doesn't fit we have two choices
			// either we loop over count and add the values individually
			// or we convert to a hugeint and multiply the hugeint
			// the problem is that hugeint multiplication is expensive
			// hence we switch here: with a low count we do the loop
			// with a high count we do the hugeint multiplication
			if (count < 8) {
				for (idx_t i = 0; i < count; i++) {
					AddValue(state.value, uint64_t(input), input >= 0);
				}
			} else {
				hugeint_t addition = hugeint_t(input) * Hugeint::Convert(count);
				state.value += addition;
			}
		}
	}